

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData * cfd::core::CryptoUtil::DecodeBase64(ByteData *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ByteData *byteData;
  ulong uVar10;
  byte local_69;
  pointer local_68;
  iterator iStack_60;
  uchar *local_58;
  ByteData *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  if ((str->_M_string_length & 3) == 0) {
    local_68 = (pointer)0x0;
    iStack_60._M_current = (uchar *)0x0;
    local_58 = (uchar *)0x0;
    local_50 = __return_storage_ptr__;
    if (str->_M_string_length != 0) {
      uVar10 = 0;
      do {
        __return_storage_ptr__ = local_50;
        pcVar2 = (str->_M_dataplus)._M_p;
        if ((pcVar2[uVar10] == '=') || (pcVar2[uVar10 + 1] == '=')) {
          ByteData::ByteData(local_50,&local_48);
          goto LAB_00302e81;
        }
        uVar7 = (ulong)(uint)(int)pcVar2[uVar10];
        if (pcVar2[uVar10 + 2] == '=') {
          lVar6 = ::std::__cxx11::string::find(-0x20,uVar7);
          uVar10 = ::std::__cxx11::string::find
                             (-0x20,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar10 + 1]);
          __return_storage_ptr__ = local_50;
          if ((lVar6 == -1) || (uVar10 == 0xffffffffffffffff)) {
            ByteData::ByteData(local_50,&local_48);
            goto LAB_00302e81;
          }
          local_69 = ((byte)(uVar10 >> 4) & 3) + (char)lVar6 * '\x04';
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,iStack_60,
                       &local_69);
          }
          else {
            *iStack_60._M_current = local_69;
LAB_00302e37:
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          break;
        }
        cVar1 = pcVar2[uVar10 + 3];
        lVar6 = ::std::__cxx11::string::find(-0x20,uVar7);
        uVar7 = ::std::__cxx11::string::find
                          (-0x20,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar10 + 1]);
        uVar8 = ::std::__cxx11::string::find
                          (-0x20,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar10 + 2]);
        __return_storage_ptr__ = local_50;
        if (cVar1 == '=') {
          if (((lVar6 == -1) || (uVar7 == 0xffffffffffffffff)) || (uVar8 == 0xffffffffffffffff)) {
            ByteData::ByteData(local_50,&local_48);
            goto LAB_00302e81;
          }
          local_69 = ((byte)(uVar7 >> 4) & 3) + (char)lVar6 * '\x04';
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,iStack_60,
                       &local_69);
          }
          else {
            *iStack_60._M_current = local_69;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
          local_69 = (byte)((uint)uVar8 >> 2) & 0xf | (byte)((int)uVar7 << 4);
          if (iStack_60._M_current != local_58) {
            *iStack_60._M_current = local_69;
            goto LAB_00302e37;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,iStack_60,
                     &local_69);
          break;
        }
        lVar9 = ::std::__cxx11::string::find
                          (-0x20,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar10 + 3]);
        __return_storage_ptr__ = local_50;
        if (((lVar6 == -1) || (uVar7 == 0xffffffffffffffff)) ||
           ((uVar8 == 0xffffffffffffffff || (lVar9 == -1)))) {
          ByteData::ByteData(local_50,&local_48);
          goto LAB_00302e81;
        }
        local_69 = ((byte)(uVar7 >> 4) & 3) + (char)lVar6 * '\x04';
        if (iStack_60._M_current == local_58) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,iStack_60,
                     &local_69);
        }
        else {
          *iStack_60._M_current = local_69;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        local_69 = (byte)(uVar8 >> 2) & 0xf | (byte)((int)uVar7 << 4);
        if (iStack_60._M_current == local_58) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,iStack_60,
                     &local_69);
        }
        else {
          *iStack_60._M_current = local_69;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        local_69 = (byte)lVar9 & 0x3f | (byte)((uint)uVar8 << 6);
        if (iStack_60._M_current == local_58) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,iStack_60,
                     &local_69);
        }
        else {
          *iStack_60._M_current = local_69;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        uVar10 = uVar10 + 4;
      } while (uVar10 < str->_M_string_length);
    }
    puVar5 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar4 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __return_storage_ptr__ = local_50;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_58;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_68;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iStack_60._M_current;
    local_68 = puVar3;
    iStack_60._M_current = puVar4;
    local_58 = puVar5;
    ByteData::ByteData(local_50,&local_48);
LAB_00302e81:
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
  }
  else {
    ByteData::ByteData(__return_storage_ptr__,&local_48);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::DecodeBase64(const std::string &str) {
  std::vector<uint8_t> dst;
  if (str.size() & 0x00000003) {
    ByteData byteData(dst);
    return byteData;
  }

  std::vector<uint8_t> cdst;
  for (std::size_t i = 0; i < str.size(); i += 4) {
    if (str[i + 0] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 1] == '=') {
      ByteData byteData(dst);
      return byteData;

    } else if (str[i + 2] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);

      if (s1 == std::string::npos || s2 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));

      break;
    } else if (str[i + 3] == '=') {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));

      break;
    } else {
      const std::string::size_type s1 = kBase64EncodeTable.find(str[i + 0]);
      const std::string::size_type s2 = kBase64EncodeTable.find(str[i + 1]);
      const std::string::size_type s3 = kBase64EncodeTable.find(str[i + 2]);
      const std::string::size_type s4 = kBase64EncodeTable.find(str[i + 3]);

      if (s1 == std::string::npos || s2 == std::string::npos ||
          s3 == std::string::npos || s4 == std::string::npos) {
        ByteData byteData(dst);
        return byteData;
      }

      cdst.push_back(
          static_cast<uint8_t>(((s1 & 0x3F) << 2) | ((s2 & 0x30) >> 4)));
      cdst.push_back(
          static_cast<uint8_t>(((s2 & 0x0F) << 4) | ((s3 & 0x3C) >> 2)));
      cdst.push_back(
          static_cast<uint8_t>(((s3 & 0x03) << 6) | ((s4 & 0x3F) >> 0)));
    }
  }
  dst.swap(cdst);
  ByteData byteData(dst);
  return byteData;
}